

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

cmpresult_t uECC_vli_cmp_unsafe(uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (uint)(byte)num_words;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((char)uVar2 < '\0') {
      return '\0';
    }
    uVar3 = (ulong)((uVar2 & 0x7f) << 3);
    uVar1 = *(ulong *)((long)left + uVar3);
    uVar3 = *(ulong *)((long)right + uVar3);
    if (uVar3 < uVar1) break;
    if (uVar1 < uVar3) {
      return -1;
    }
  }
  return '\x01';
}

Assistant:

static cmpresult_t uECC_vli_cmp_unsafe(const uECC_word_t *left,
                                       const uECC_word_t *right,
                                       wordcount_t num_words) {
    wordcount_t i;
    for (i = num_words - 1; i >= 0; --i) {
        if (left[i] > right[i]) {
            return 1;
        } else if (left[i] < right[i]) {
            return -1;
        }
    }
    return 0;
}